

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O2

optional<wasm::WATParser::(anonymous_namespace)::LexIntResult> *
wasm::WATParser::anon_unknown_0::integer
          (optional<wasm::WATParser::(anonymous_namespace)::LexIntResult> *__return_storage_ptr__,
          string_view in)

{
  bool *this;
  bool bVar1;
  OverflowBehavior in_R8D;
  string_view sVar2;
  string_view sv;
  string_view sv_00;
  string_view in_00;
  string_view in_01;
  undefined1 local_68 [8];
  optional<wasm::WATParser::(anonymous_namespace)::LexIntResult> lexed;
  LexIntCtx ctx;
  
  lexed.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>.
  _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>.
  _32_8_ = in._M_len;
  sVar2._M_str = "+";
  sVar2._M_len = 1;
  bVar1 = LexCtx::takePrefix((LexCtx *)
                             &lexed.
                              super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
                              ._M_payload.
                              super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>
                              ._M_engaged,sVar2);
  if (!bVar1) {
    sv._M_str = "-";
    sv._M_len = 1;
    LexCtx::takePrefix((LexCtx *)
                       &lexed.
                        super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
                        ._M_payload.
                        super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>
                        ._M_engaged,sv);
  }
  sv_00._M_str = "0x";
  sv_00._M_len = 2;
  bVar1 = LexCtx::takePrefix((LexCtx *)
                             &lexed.
                              super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
                              ._M_payload.
                              super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>
                              ._M_engaged,sv_00);
  this = &lexed.
          super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>.
          _M_payload.
          super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>.
          _M_engaged;
  if (bVar1) {
    sVar2 = LexCtx::next((LexCtx *)this);
    in_00._M_len = sVar2._M_str;
    in_00._M_str = (char *)0x0;
    hexnum((optional<wasm::WATParser::(anonymous_namespace)::LexIntResult> *)local_68,
           (anon_unknown_0 *)sVar2._M_len,in_00,in_R8D);
  }
  else {
    sVar2 = LexCtx::next((LexCtx *)this);
    in_01._M_len = sVar2._M_str;
    in_01._M_str = (char *)0x0;
    num((optional<wasm::WATParser::(anonymous_namespace)::LexIntResult> *)local_68,
        (anon_unknown_0 *)sVar2._M_len,in_01,in_R8D);
  }
  if ((lexed.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>.
       _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>
       ._M_payload._M_value.sign._0_1_ == '\x01') &&
     (bVar1 = LexCtx::canFinish((LexCtx *)
                                &lexed.
                                 super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
                                 ._M_payload.
                                 super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>
                                 ._M_engaged), bVar1)) {
    LexIntCtx::lexed(__return_storage_ptr__,
                     (LexIntCtx *)
                     &lexed.
                      super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
                      ._M_payload.
                      super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>
                      ._M_engaged);
  }
  else {
    (__return_storage_ptr__->
    super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>).
    _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>.
    _M_engaged = false;
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<LexIntResult> integer(std::string_view in) {
  LexIntCtx ctx(in);
  ctx.takeSign();
  if (ctx.takePrefix("0x"sv)) {
    if (auto lexed = hexnum(ctx.next())) {
      ctx.take(*lexed);
      if (ctx.canFinish()) {
        return ctx.lexed();
      }
    }
    // TODO: Add error production for unrecognized hexnum.
    return {};
  }
  if (auto lexed = num(ctx.next())) {
    ctx.take(*lexed);
    if (ctx.canFinish()) {
      return ctx.lexed();
    }
  }
  return {};
}